

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# univalue.h
# Opt level: O3

optional<long> SettingToInt(SettingsValue *value)

{
  long lVar1;
  int iVar2;
  VType VVar3;
  _Storage<long,_true> _Var4;
  string *psVar5;
  ulong unaff_RBX;
  long in_FS_OFFSET;
  optional<long> oVar6;
  string_view str;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  VVar3 = value->typ;
  _Var4._M_value._4_4_ = 0;
  _Var4._M_value._0_4_ = VVar3;
  if (VVar3 == VNULL) {
    unaff_RBX = 0;
  }
  else {
    if (VVar3 == VBOOL) {
      iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare(&value->val,"1");
      unaff_RBX = CONCAT71((int7)(unaff_RBX >> 8),1);
      if (iVar2 != 0) {
        _Var4._M_value = 0;
        goto LAB_006681ae;
      }
      VVar3 = value->typ;
      if (VVar3 == VBOOL) {
        iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                compare(&value->val,"1");
        if (iVar2 == 0) {
          _Var4._M_value = 1;
          goto LAB_006681ae;
        }
        VVar3 = value->typ;
      }
    }
    if (VVar3 == VNUM) {
      _Var4._M_value = UniValue::getInt<long>(value);
    }
    else {
      psVar5 = UniValue::get_str_abi_cxx11_(value);
      str._M_str = (psVar5->_M_dataplus)._M_p;
      str._M_len = psVar5->_M_string_length;
      _Var4._M_value = LocaleIndependentAtoi<long>(str);
    }
    unaff_RBX = CONCAT71((int7)(unaff_RBX >> 8),1);
  }
LAB_006681ae:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    oVar6.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>._8_8_
         = unaff_RBX & 0xffffffff;
    oVar6.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
    _M_payload._M_value = _Var4._M_value;
    return (optional<long>)
           oVar6.super__Optional_base<long,_true,_true>._M_payload.
           super__Optional_payload_base<long>;
  }
  __stack_chk_fail();
}

Assistant:

bool isFalse() const { return (typ == VBOOL) && (val != "1"); }